

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_keyx.c
# Opt level: O0

int pkey_gost_ec_derive(EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  int iVar1;
  EC_KEY *pEVar2;
  long *in_RDX;
  uchar *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  EC_KEY *in_stack_00000008;
  EC_POINT *in_stack_00000010;
  uchar *in_stack_00000018;
  int dgst_nid;
  gost_pmeth_data *data;
  EVP_PKEY *peer_key;
  EVP_PKEY *my_key;
  char *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  int local_3c;
  void *local_38;
  EVP_PKEY *local_30;
  EVP_PKEY *local_28;
  long *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar3;
  
  local_20 = in_RDX;
  local_28 = EVP_PKEY_CTX_get0_pkey(in_RDI);
  local_30 = EVP_PKEY_CTX_get0_peerkey(in_RDI);
  local_38 = EVP_PKEY_CTX_get_data(in_RDI);
  local_3c = 0;
  if ((local_38 == (void *)0x0) || (*(long *)((long)local_38 + 0x30) == 0)) {
    ERR_GOST_error((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffff78,0);
    uVar3 = 0;
  }
  else if (*(int *)((long)local_38 + 0x40) == 0) {
    if (*(long *)((long)local_38 + 0x30) == 8) {
      if (in_RSI == (uchar *)0x0) {
        *local_20 = 0x20;
        uVar3 = 1;
      }
      else {
        EVP_PKEY_get_default_digest_nid(local_28,&local_3c);
        iVar1 = (int)((ulong)in_RDI >> 0x20);
        if (local_3c == 0x3d7) {
          local_3c = 0x3d6;
        }
        pEVar2 = (EC_KEY *)EVP_PKEY_get0(local_30);
        EC_KEY_get0_public_key(pEVar2);
        EVP_PKEY_get0(local_28);
        iVar1 = VKO_compute_key(in_stack_00000018,in_stack_00000010,in_stack_00000008,
                                (uchar *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),iVar1)
        ;
        *local_20 = (long)iVar1;
        uVar3 = (uint)(*local_20 != 0);
      }
    }
    else if (*(long *)((long)local_38 + 0x30) == 0x20) {
      if (in_RSI == (uchar *)0x0) {
        *local_20 = 0x40;
        uVar3 = 1;
      }
      else {
        EVP_PKEY_get_id(local_28);
        pEVar2 = (EC_KEY *)EVP_PKEY_get0(local_30);
        EC_KEY_get0_public_key(pEVar2);
        EVP_PKEY_get0(local_28);
        iVar1 = gost_keg((uchar *)in_stack_00000008,unaff_retaddr_00,
                         (EC_POINT *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (EC_KEY *)in_RDI,in_RSI);
        *local_20 = (long)iVar1;
        uVar3 = (uint)(*local_20 != 0);
      }
    }
    else {
      uVar3 = 0;
    }
  }
  else if (in_RSI == (uchar *)0x0) {
    iVar1 = 0x40;
    if (*(int *)((long)local_38 + 0x40) == 0x3d6) {
      iVar1 = 0x20;
    }
    *local_20 = (long)iVar1;
    uVar3 = 1;
  }
  else {
    pEVar2 = (EC_KEY *)EVP_PKEY_get0(local_30);
    iVar1 = (int)((ulong)in_RDI >> 0x20);
    EC_KEY_get0_public_key(pEVar2);
    EVP_PKEY_get0(local_28);
    iVar1 = VKO_compute_key(in_stack_00000018,in_stack_00000010,in_stack_00000008,
                            (uchar *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),iVar1);
    *local_20 = (long)iVar1;
    uVar3 = (uint)(*local_20 != 0);
  }
  return uVar3;
}

Assistant:

int pkey_gost_ec_derive(EVP_PKEY_CTX *ctx, unsigned char *key, size_t *keylen)
{
    /*
     * Public key of peer in the ctx field peerkey
     * Our private key in the ctx pkey
     * ukm is in the algorithm specific context data
     */
    EVP_PKEY *my_key = EVP_PKEY_CTX_get0_pkey(ctx);
    EVP_PKEY *peer_key = EVP_PKEY_CTX_get0_peerkey(ctx);
    struct gost_pmeth_data *data = EVP_PKEY_CTX_get_data(ctx);
    int dgst_nid = NID_undef;

    if (!data || data->shared_ukm_size == 0) {
        GOSTerr(GOST_F_PKEY_GOST_EC_DERIVE, GOST_R_UKM_NOT_SET);
        return 0;
    }

    /* VKO */
    if (data->vko_dgst_nid) {
        if (!key) {
            *keylen = data->vko_dgst_nid == NID_id_GostR3411_2012_256? 32 : 64;
            return 1;
        }
        *keylen = VKO_compute_key(key,
                                  EC_KEY_get0_public_key(EVP_PKEY_get0(peer_key)),
                                  (EC_KEY *)EVP_PKEY_get0(my_key),
                                  data->shared_ukm, data->shared_ukm_size,
                                  data->vko_dgst_nid);
        return (*keylen) ? 1 : 0;
    }

    /*
     * shared_ukm_size = 8 stands for pre-2018 cipher suites
     * It means 32 bytes of key length, 8 byte UKM, 32-bytes hash
     *
     * shared_ukm_size = 32 stands for post-2018 cipher suites
     * It means 64 bytes of shared_key, 16 bytes of UKM and either
     * 64 bytes of hash or 64 bytes of TLSTREE output
     * */

    switch (data->shared_ukm_size) {
    case 8:
        {
            if (key == NULL) {
                *keylen = 32;
                return 1;
            }
            EVP_PKEY_get_default_digest_nid(my_key, &dgst_nid);
            if (dgst_nid == NID_id_GostR3411_2012_512)
                dgst_nid = NID_id_GostR3411_2012_256;

            *keylen =
                VKO_compute_key(key,
                                EC_KEY_get0_public_key(EVP_PKEY_get0(peer_key)),
                                (EC_KEY *)EVP_PKEY_get0(my_key),
                                data->shared_ukm, 8, dgst_nid);
            return (*keylen) ? 1 : 0;
        }
        break;
    case 32:
        {
            if (key == NULL) {
                *keylen = 64;
                return 1;
            }

            *keylen = gost_keg(data->shared_ukm, EVP_PKEY_id(my_key),
                               EC_KEY_get0_public_key(EVP_PKEY_get0(peer_key)),
                               (EC_KEY *)EVP_PKEY_get0(my_key), key);
            return (*keylen) ? 1 : 0;
        }

        break;
    default:
        return 0;
    }
}